

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

void run_read(cio_buffered_stream *buffered_stream)

{
  cio_bs_state cVar1;
  cio_bs_state err;
  cio_buffered_stream *buffered_stream_local;
  
  while( true ) {
    if (buffered_stream->read_job == (_func_cio_bs_state_cio_buffered_stream_ptr *)0x0) {
      return;
    }
    cVar1 = (*buffered_stream->read_job)(buffered_stream);
    if (cVar1 == CIO_BS_AGAIN) break;
    if (cVar1 == CIO_BS_CLOSED) {
      return;
    }
  }
  fill_buffer(buffered_stream);
  return;
}

Assistant:

static void run_read(struct cio_buffered_stream *buffered_stream)
{
	while (buffered_stream->read_job != NULL) {
		enum cio_bs_state err = buffered_stream->read_job(buffered_stream);
		if (err == CIO_BS_AGAIN) {
			fill_buffer(buffered_stream);
			return;
		}

		if (err == CIO_BS_CLOSED) {
			return;
		}
	}
}